

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a2a.h
# Opt level: O2

void bsplib::serial<unsigned_int>(A2A *a2a,int pid,uint x)

{
  ssize_t sVar1;
  undefined4 in_register_00000014;
  int in_R8D;
  Buffer buf;
  undefined1 local_1d [5];
  
  sVar1 = UIntSerialize<unsigned_int>::write(x,local_1d,CONCAT44(in_register_00000014,x));
  A2A::send(a2a,pid,local_1d,(long)(int)sVar1,in_R8D);
  return;
}

Assistant:

void serial( A2A & a2a, int pid, UInt x ) {
    typedef UIntSerialize< UInt > S;     
    typename S::Buffer buf;
    { const int n = S::write(x, buf );
      a2a.send( pid, buf, n );
    }
}